

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt_soa.h
# Opt level: O0

Ray * __thiscall pbrt::SOA<pbrt::Ray>::operator[](SOA<pbrt::Ray> *this,int i)

{
  undefined8 uVar1;
  int in_EDX;
  long in_RSI;
  Ray *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Point3f PVar5;
  Vector3f VVar6;
  Ray *r;
  Ray *this_00;
  SOA<pbrt::Vector3<float>_> *in_stack_ffffffffffffffb0;
  undefined1 auVar4 [56];
  
  auVar4 = in_ZMM0._8_56_;
  this_00 = in_RDI;
  Ray::Ray(in_RDI);
  PVar5 = SOA<pbrt::Point3<float>_>::operator[]
                    ((SOA<pbrt::Point3<float>_> *)in_stack_ffffffffffffffb0,
                     (int)((ulong)in_RSI >> 0x20));
  auVar2._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar4;
  uVar1 = vmovlpd_avx(auVar2._0_16_);
  (in_RDI->o).super_Tuple3<pbrt::Point3,_float>.z = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
  (in_RDI->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (in_RDI->o).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar6 = SOA<pbrt::Vector3<float>_>::operator[]
                    (in_stack_ffffffffffffffb0,(int)((ulong)in_RSI >> 0x20));
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  (in_RDI->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->d).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->d).super_Tuple3<pbrt::Vector3,_float>.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  in_RDI->time = *(Float *)(*(long *)(in_RSI + 0x48) + (long)in_EDX * 4);
  Medium::operator=((Medium *)this_00,(Medium *)in_RDI);
  return this_00;
}

Assistant:

PBRT_CPU_GPU
    Ray operator[](int i) const {
        DCHECK_LT(i, nAlloc);
        Ray r;
        r.o = this->o[i];
        r.d = this->d[i];
        r.time = this->time[i];
        r.medium = this->medium[i];
        return r;
    }